

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QOpenGLTexture::allocateStorage(QOpenGLTexture *this)

{
  uint uVar1;
  PixelFormat PVar2;
  QOpenGLTexturePrivate *pQVar3;
  bool bVar4;
  ulong uVar5;
  PixelType pixelType;
  PixelType pixelType_00;
  PixelFormat in_ESI;
  undefined8 *puVar6;
  
  pQVar3 = (this->d_ptr).d;
  bVar4 = QOpenGLTexturePrivate::create(pQVar3);
  if (!bVar4) {
    return;
  }
  PVar2 = pQVar3->format;
  uVar1 = PVar2 - 0x93b0;
  puVar6 = (undefined8 *)0x3fff00003fff;
  if ((uVar1 < 0x2e) && ((0x3fff00003fffU >> ((ulong)uVar1 & 0x3f) & 1) != 0))
  goto switchD_00153872_caseD_8c41;
  switch(PVar2) {
  case 0x8229:
  case 0x822a:
    pixelType = UInt8;
    break;
  case 0x822b:
  case 0x822c:
    pixelType = UInt8;
    goto LAB_001539ea;
  case 0x822d:
    pixelType = Float16;
    break;
  case 0x822e:
    pixelType = Float32;
    break;
  case 0x822f:
    pixelType = Float16;
    goto LAB_001539ea;
  case 0x8230:
    pixelType = Float32;
LAB_001539ea:
    in_ESI = RG;
    goto switchD_00153926_caseD_8c41;
  case 0x8231:
  case 0x8233:
  case 0x8235:
    pixelType = Int8;
    goto LAB_001538c9;
  case 0x8232:
  case 0x8234:
  case 0x8236:
    pixelType = UInt8;
LAB_001538c9:
    in_ESI = Red_Integer;
    goto switchD_00153926_caseD_8c41;
  case 0x8237:
  case 0x8239:
  case 0x823b:
    pixelType = Int8;
    goto LAB_001538f5;
  case 0x8238:
  case 0x823a:
  case 0x823c:
    pixelType = UInt8;
LAB_001538f5:
    in_ESI = RG_Integer;
    goto switchD_00153926_caseD_8c41;
  default:
    switch(PVar2) {
    case 0x9270:
    case 0x9271:
      in_ESI = Red;
      break;
    case 0x9272:
    case 0x9273:
      in_ESI = RG;
      break;
    case 0x9274:
    case 0x9275:
      in_ESI = RGB;
      break;
    case 0x9276:
    case 0x9277:
    case 0x9278:
    case 0x9279:
      goto switchD_00153872_caseD_8c41;
    default:
      pixelType_00 = PVar2 - 0x8d70;
      switch(pixelType_00) {
      case NoPixelType:
      case 6:
      case 0xc:
        pixelType = UInt8;
        break;
      case 1:
      case 7:
      case 0xd:
        pixelType = UInt8;
        goto LAB_001538e6;
      case 2:
      case 3:
      case 4:
      case 5:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
        goto code_r0x00153a36;
      case 0x12:
switchD_0015388d_caseD_0:
        pixelType = Int8;
        break;
      case 0x13:
switchD_0015388d_caseD_1:
        pixelType = Int8;
LAB_001538e6:
        in_ESI = RGB_Integer;
        goto switchD_00153926_caseD_8c41;
      default:
        switch(PVar2) {
        case 0x8f94:
        case 0x8f98:
          pixelType = Int8;
          goto LAB_001539f6;
        case 0x8f95:
        case 0x8f99:
          pixelType = Int8;
          goto LAB_001539ea;
        case 0x8f96:
        case 0x8f9a:
          pixelType = Int8;
          goto LAB_00153a02;
        case 0x8f97:
        case 0x8f9b:
          pixelType = Int8;
          goto LAB_00153a0e;
        default:
          if (PVar2 - Depth < 9) {
            pixelType_00 = (&switchD_00153821::switchdataD_00179730)[PVar2 - Depth] + 0x179730;
            switch(PVar2) {
            case Depth:
              pixelType = UInt32;
              in_ESI = PVar2;
              break;
            case Red:
            case 0x1904:
            case 0x1905:
              goto code_r0x00153a36;
            default:
              pixelType = UInt8;
              in_ESI = PVar2;
            }
            goto switchD_00153926_caseD_8c41;
          }
        }
        pixelType_00 = PVar2 - 0x8051;
        switch(pixelType_00) {
        case NoPixelType:
        case 3:
          pixelType = UInt8;
          goto LAB_00153a02;
        case 1:
        case 2:
        case 4:
        case 8:
        case 9:
          goto code_r0x00153a36;
        case 5:
          pixelType = UInt16_RGBA4;
          break;
        case 6:
          pixelType = UInt16_RGB5A1;
          break;
        case 7:
        case 10:
          pixelType = UInt8;
          break;
        default:
          if (PVar2 - 0x83f0 < 4) goto switchD_00153872_caseD_8c41;
          pixelType_00 = PVar2 - 0x8814;
          switch(pixelType_00) {
          case NoPixelType:
            pixelType = Float32;
            goto LAB_00153a0e;
          case 1:
            pixelType = Float32;
            break;
          case 2:
          case 3:
          case 4:
          case 5:
            goto code_r0x00153a36;
          case 6:
            pixelType = Float16;
            goto LAB_00153a0e;
          case 7:
            pixelType = Float16;
            break;
          default:
            if (9 < PVar2 - 0x8c3a) {
              if (3 < PVar2 - 0x8c4c) {
                pixelType_00 = PVar2 - 0x8d88;
                switch(pixelType_00) {
                case NoPixelType:
                case 6:
                  goto switchD_0015388d_caseD_0;
                case 1:
                case 7:
                  goto switchD_0015388d_caseD_1;
                case 2:
                case 3:
                case 4:
                case 5:
                  goto code_r0x00153a36;
                }
                if ((3 < PVar2 - 0x8dbb) && (3 < PVar2 - 0x8e8c)) {
                  in_ESI = Depth;
                  if (PVar2 - 0x81a5 < 3) goto LAB_0015366b;
                  if (PVar2 == NoSourceFormat) {
                    pixelType = NoPixelType;
                    in_ESI = PVar2;
                    goto switchD_00153926_caseD_8c41;
                  }
                  if (PVar2 != 0x2a10) {
                    if (PVar2 != 0x88f0) {
                      if (PVar2 == 0x8cac) goto LAB_0015366b;
                      if (PVar2 != 0x8cad) {
                        if (PVar2 == 0x8d48) {
                          pixelType = UInt8;
                          in_ESI = Stencil;
                          goto switchD_00153926_caseD_8c41;
                        }
                        if (PVar2 != 0x8d62) {
                          if (PVar2 != 0x8d64) {
                            pixelType = UInt32_RGB10A2;
                            goto LAB_00153a0e;
                          }
                          goto switchD_00153872_caseD_8c41;
                        }
                        pixelType = UInt16_R5G6B5;
                        break;
                      }
                    }
                    in_ESI = DepthStencil;
                    goto LAB_0015366b;
                  }
                  pixelType = UInt8_RG3B2;
                  break;
                }
              }
switchD_00153872_caseD_8c41:
              in_ESI = RGBA;
              goto LAB_0015366b;
            }
            in_ESI = 0x1797f0;
            pixelType_00 = (&switchD_00153872::switchdataD_001797f0)[PVar2 - 0x8c3a] + 0x1797f0;
            switch(PVar2) {
            case 0x8c3a:
              pixelType = UInt32_RG11B10F;
              break;
            default:
              goto code_r0x00153a36;
            case 0x8c3d:
              pixelType = UInt16_RGB5A1_Rev;
              break;
            case 0x8c41:
            case 0x8c43:
              goto switchD_00153872_caseD_8c41;
            }
          }
LAB_00153a02:
          in_ESI = RGB;
          goto switchD_00153926_caseD_8c41;
        }
LAB_00153a0e:
        in_ESI = RGBA;
        goto switchD_00153926_caseD_8c41;
      }
      in_ESI = RGBA_Integer;
      goto switchD_00153926_caseD_8c41;
    }
LAB_0015366b:
    pixelType_00 = UInt8;
    pixelType = UInt8;
    if ((uVar1 < 0x2e) && ((0x3fff00003fffU >> ((ulong)uVar1 & 0x3f) & 1) != 0))
    goto switchD_00153926_caseD_8c41;
    switch(PVar2) {
    case 0x8229:
    case 0x822a:
    case 0x822b:
    case 0x822c:
    case 0x8232:
    case 0x8234:
    case 0x8236:
    case 0x8238:
    case 0x823a:
    case 0x823c:
      break;
    case 0x822d:
    case 0x822f:
switchD_0015377d_caseD_822d:
      pixelType = Float16;
      break;
    case 0x822e:
    case 0x8230:
switchD_0015377d_caseD_822e:
      pixelType = Float32;
      break;
    case 0x8231:
    case 0x8233:
    case 0x8235:
    case 0x8237:
    case 0x8239:
    case 0x823b:
switchD_0015377d_caseD_8231:
      pixelType = Int8;
      break;
    default:
      uVar5 = (ulong)(PVar2 - 0x8d48);
      if (PVar2 - 0x8d48 < 0x3c) {
        if ((0x30c30010000001U >> (uVar5 & 0x3f) & 1) != 0) break;
        puVar6 = (undefined8 *)0xc00000000000000;
        if ((0xc00000000000000U >> (uVar5 & 0x3f) & 1) != 0) goto switchD_0015377d_caseD_8231;
        if (uVar5 == 0x1a) {
          pixelType = UInt16_R5G6B5;
          break;
        }
      }
      if (PVar2 - 0x9270 < 10) break;
      uVar1 = PVar2 - 0x8d88;
      if (uVar1 < 0x37) {
        if ((0xc3UL >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto switchD_0015377d_caseD_8231;
        puVar6 = (undefined8 *)0x78000000000000;
        if ((0x78000000000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) break;
      }
      if (PVar2 - 0x83f0 < 4) break;
      switch(PVar2) {
      case 0x8c3a:
        pixelType = UInt32_RG11B10F;
        break;
      case 0x8c3b:
      case 0x8c3c:
      case 0x8c3e:
      case 0x8c3f:
      case 0x8c40:
      case 0x8c42:
code_r0x00153a36:
        pQVar3 = (QOpenGLTexturePrivate *)*puVar6;
        bVar4 = QOpenGLTexturePrivate::create(pQVar3);
        if (!bVar4) {
          return;
        }
        QOpenGLTexturePrivate::allocateStorage(pQVar3,in_ESI,pixelType_00);
        return;
      case 0x8c3d:
        pixelType = UInt16_RGB5A1_Rev;
        break;
      case 0x8c41:
      case 0x8c43:
        break;
      default:
        if ((PVar2 - 0x8c4c < 4) || (PVar2 - 0x8e8c < 4)) break;
        if (PVar2 - 0x81a6 < 2) {
          pixelType = UInt32;
          break;
        }
        if (1 < PVar2 - 0x8814) {
          if (PVar2 - 0x881a < 2) goto switchD_0015377d_caseD_822d;
          if (PVar2 == 0x81a5) {
            pixelType = UInt16;
            break;
          }
          if (PVar2 == 0x88f0) {
            pixelType = UInt32_D24S8;
            break;
          }
          if (PVar2 != 0x8cac) {
            pixelType = Float32_D32_UInt32_S8_X24;
            break;
          }
        }
        goto switchD_0015377d_caseD_822e;
      }
    }
    goto switchD_00153926_caseD_8c41;
  }
LAB_001539f6:
  in_ESI = Red;
switchD_00153926_caseD_8c41:
  QOpenGLTexturePrivate::allocateStorage(pQVar3,in_ESI,pixelType);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }